

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

string * __thiscall
filesystem::path::str_abi_cxx11_(string *__return_storage_ptr__,path *this,path_type type)

{
  size_type sVar1;
  pointer pbVar2;
  char cVar3;
  size_type *psVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  if (this->m_absolute == true) {
    if (this->m_type == native_path) {
      std::operator<<((ostream *)&oss,"/");
    }
    else {
      pbVar2 = (this->m_path).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = 0;
      psVar4 = &pbVar2->_M_string_length;
      lVar8 = (long)(this->m_path).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        sVar1 = *psVar4;
        psVar4 = psVar4 + 4;
        uVar7 = uVar7 + 1 + sVar1;
      }
      bVar9 = this->m_smb;
      uVar5 = uVar7 + 2;
      if (bVar9 == false) {
        uVar5 = uVar7;
      }
      if (uVar5 < 0x105) {
        if (bVar9 == false) goto LAB_00464190;
        pcVar6 = "\\\\";
      }
      else {
        pcVar6 = "\\\\?\\";
        if (bVar9 != false) {
          pcVar6 = "\\\\?\\UNC\\";
        }
      }
      std::operator<<((ostream *)&oss,pcVar6);
    }
  }
LAB_00464190:
  cVar3 = '\\';
  if (type == native_path) {
    cVar3 = '/';
  }
  lVar8 = 0;
  for (uVar7 = 1;
      pbVar2 = (this->m_path).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 - 1 <
      (ulong)((long)(this->m_path).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar7 = uVar7 + 1) {
    std::operator<<((ostream *)&oss,(string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar8));
    if (uVar7 < (ulong)((long)(this->m_path).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_path).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::operator<<((ostream *)&oss,cVar3);
    }
    lVar8 = lVar8 + 0x20;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string str(path_type type = native_path) const {
        std::ostringstream oss;

        if (m_absolute) {
            if (m_type == posix_path)
                oss << "/";
            else {
                size_t length = 0;
                for (size_t i = 0; i < m_path.size(); ++i)
                    // No special case for the last segment to count the NULL character
                    length += m_path[i].length() + 1;
                if (m_smb)
                    length += 2;

                // Windows requires a \\?\ prefix to handle paths longer than MAX_PATH
                // (including their null character). NOTE: relative paths >MAX_PATH are
                // not supported at all in Windows.
                if (length > MAX_PATH_WINDOWS_LEGACY) {
                    if (m_smb)
                        oss << "\\\\?\\UNC\\";
                    else
                        oss << "\\\\?\\";
                } else if (m_smb)
                    oss << "\\\\";
            }
        }

        for (size_t i=0; i<m_path.size(); ++i) {
            oss << m_path[i];
            if (i+1 < m_path.size()) {
                if (type == posix_path)
                    oss << '/';
                else
                    oss << '\\';
            }
        }

        return oss.str();
    }